

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

string * libcellml::convertNonSiUnits(string *__return_storage_ptr__,string *unitsName)

{
  bool bVar1;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *unitsName_local;
  
  local_18 = unitsName;
  unitsName_local = __return_storage_ptr__;
  bVar1 = std::operator==(unitsName,"liter");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"litre",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  else {
    bVar1 = std::operator==(local_18,"meter");
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"metre",local_2d);
      std::allocator<char>::~allocator(local_2d);
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_18);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string convertNonSiUnits(const std::string &unitsName)
{
    if (unitsName == "liter") {
        return "litre";
    }

    if (unitsName == "meter") {
        return "metre";
    }

    return unitsName;
}